

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nlsol_ex_nl.h
# Opt level: O1

void __thiscall
ExampleNLFeeder::
FeedConBounds<mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,ExampleNLFeeder>>::ConBndWriter>
          (ExampleNLFeeder *this,ConBndWriter *cbw)

{
  long lVar1;
  
  lVar1 = -3;
  do {
    mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_>::WriteBndRangeOrCompl
              (cbw->nlw_,&cbw->nlw_->nm,this->mdl_->con_ub[lVar1],
               (double)this->mdl_->con_name[lVar1],0,0);
    cbw->nWrt_ = cbw->nWrt_ + 1;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0);
  return;
}

Assistant:

void FeedConBounds(ConBoundsWriter& cbw) {
    for (int j=0; j<Model().n_con; j++) {
      AlgConRange bnd;
      bnd.L = Model().con_lb[j];
      bnd.U = Model().con_ub[j];
      cbw.WriteAlgConRange(bnd);
    }
  }